

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynVariableDefinitions * ParseVariableDefinitions(ParseContext *ctx,bool classMembers)

{
  Lexeme *begin;
  int iVar1;
  SynAlign *pSVar2;
  SynBase *pSVar3;
  SynVariableDefinition *pSVar4;
  Lexeme *pLVar5;
  undefined4 extraout_var;
  LexemeType LVar6;
  char *msg;
  IntrusiveList<SynVariableDefinition> definitions;
  IntrusiveList<SynVariableDefinition> local_58;
  SynVariableDefinition *local_48;
  SynVariableDefinition *pSStack_40;
  SynVariableDefinitions *this;
  
  begin = ctx->currentLexeme;
  pSVar2 = ParseAlign(ctx);
  pSVar3 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar3 == (SynBase *)0x0) {
LAB_001157ca:
    ctx->currentLexeme = begin;
    return (SynVariableDefinitions *)0x0;
  }
  local_58.head = (SynVariableDefinition *)0x0;
  local_58.tail = (SynVariableDefinition *)0x0;
  pSVar4 = ParseVariableDefinition(ctx);
  if (pSVar4 == (SynVariableDefinition *)0x0) {
    if (pSVar2 != (SynAlign *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,
                 "ERROR: variable or class definition is expected after alignment specifier");
    }
    goto LAB_001157ca;
  }
  IntrusiveList<SynVariableDefinition>::push_back(&local_58,pSVar4);
  pLVar5 = ctx->currentLexeme;
  LVar6 = pLVar5->type;
  while (LVar6 == lex_comma) {
    ctx->currentLexeme = pLVar5 + 1;
    pSVar4 = ParseVariableDefinition(ctx);
    if (pSVar4 == (SynVariableDefinition *)0x0) {
      if (!classMembers) {
        anon_unknown.dwarf_15b62::Report
                  (ctx,ctx->currentLexeme,"ERROR: next variable definition excepted after \',\'");
        pLVar5 = ctx->currentLexeme;
        LVar6 = pLVar5->type;
        goto LAB_00115819;
      }
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: member name expected after \',\'");
      goto LAB_001157f6;
    }
    IntrusiveList<SynVariableDefinition>::push_back(&local_58,pSVar4);
    pLVar5 = ctx->currentLexeme;
    LVar6 = pLVar5->type;
  }
  if (classMembers) {
LAB_001157f6:
    msg = "ERROR: \';\' not found after class member list";
  }
  else {
LAB_00115819:
    if (LVar6 == lex_obracket) {
      msg = "ERROR: array size must be specified after type name";
    }
    else {
      if (LVar6 == lex_semicolon) {
        ctx->currentLexeme = pLVar5 + 1;
        goto LAB_0011584f;
      }
      msg = "ERROR: \';\' not found after variable definition";
    }
  }
  anon_unknown.dwarf_15b62::CheckConsume(ctx,lex_semicolon,msg);
LAB_0011584f:
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  this = (SynVariableDefinitions *)CONCAT44(extraout_var,iVar1);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    local_48 = local_58.head;
    pSStack_40 = local_58.tail;
    SynBase::SynBase((SynBase *)this,0x34,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00222d38;
    this->align = pSVar2;
    this->type = pSVar3;
    (this->definitions).head = local_48;
    (this->definitions).tail = pSStack_40;
    return this;
  }
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynVariableDefinitions* ParseVariableDefinitions(ParseContext &ctx, bool classMembers)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(SynBase *type = ParseType(ctx))
	{
		IntrusiveList<SynVariableDefinition> definitions;

		SynVariableDefinition *definition = ParseVariableDefinition(ctx);

		if(!definition)
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: variable or class definition is expected after alignment specifier");

			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		definitions.push_back(definition);

		while(ctx.Consume(lex_comma))
		{
			definition = ParseVariableDefinition(ctx);

			if(!definition)
			{
				if(classMembers)
					Report(ctx, ctx.Current(), "ERROR: member name expected after ','");
				else
					Report(ctx, ctx.Current(), "ERROR: next variable definition excepted after ','");

				break;
			}

			definitions.push_back(definition);
		}

		if(classMembers)
		{
			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			if(ctx.Peek() == lex_obracket)
				CheckConsume(ctx, lex_semicolon, "ERROR: array size must be specified after type name");
			else
				CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after variable definition");
		}

		return new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), align, type, definitions);
	}
	
	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}